

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O0

void __thiscall
llvm::yaml::NullNode::NullNode
          (NullNode *this,
          unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *D)

{
  StringRef T;
  StringRef local_38;
  StringRef local_28;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *local_18;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *D_local;
  NullNode *this_local;
  
  local_18 = D;
  D_local = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)this;
  memset(&local_28,0,0x10);
  StringRef::StringRef(&local_28);
  memset(&local_38,0,0x10);
  StringRef::StringRef(&local_38);
  T.Length = local_38.Length;
  T.Data = local_38.Data;
  Node::Node(&this->super_Node,0,D,local_28,T);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_anchor_030a5160;
  return;
}

Assistant:

NullNode(std::unique_ptr<Document> &D)
      : Node(NK_Null, D, StringRef(), StringRef()) {}